

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

string * __thiscall
tinyformat::format<std::__cxx11::string,wallet::WalletFeature>
          (string *__return_storage_ptr__,tinyformat *this,char *fmt,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          WalletFeature *args_1)

{
  long in_FS_OFFSET;
  ostringstream oss;
  ostream oStack_1a8;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oStack_1a8);
  format<std::__cxx11::string,wallet::WalletFeature>
            (&oStack_1a8,(char *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fmt,
             (WalletFeature *)args);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oStack_1a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}